

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O1

int32_t __thiscall
icu_63::UnicodeSetStringSpan::spanBack
          (UnicodeSetStringSpan *this,UChar *s,int32_t length,USetSpanCondition spanCondition)

{
  UnicodeSet *this_00;
  UChar *pUVar1;
  short *psVar2;
  short *psVar3;
  byte bVar4;
  ushort uVar5;
  UChar UVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  UBool UVar10;
  uint uVar11;
  uint uVar12;
  int32_t iVar13;
  UBool *pUVar14;
  void *pvVar15;
  ushort *puVar16;
  char cVar17;
  int iVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  long lVar26;
  int iVar27;
  UChar *pUVar28;
  uint uVar29;
  long lVar30;
  UChar *pUVar31;
  bool bVar32;
  uint local_dc;
  uint local_d8;
  OffsetList local_78;
  long local_50;
  uint8_t *local_48;
  UChar *local_40;
  long local_38;
  
  if (spanCondition == USET_SPAN_NOT_CONTAINED) {
    iVar13 = spanNotBack(this,s,length);
    return iVar13;
  }
  this_00 = &this->spanSet;
  uVar11 = UnicodeSet::spanBack(this_00,s,length,USET_SPAN_CONTAINED);
  if (uVar11 == 0) {
    local_d8 = 0;
  }
  else {
    local_78.list = local_78.staticList;
    local_78.capacity = 0;
    local_78.length = 0;
    local_78.start = 0;
    if (spanCondition == USET_SPAN_CONTAINED) {
      iVar25 = this->maxLength16;
      iVar27 = 0x10;
      pUVar14 = local_78.list;
      if (((long)iVar25 < 0x11) ||
         (pUVar14 = (UBool *)uprv_malloc_63((long)iVar25), iVar27 = iVar25, pUVar14 != (UBool *)0x0)
         ) {
        local_78.list = pUVar14;
        local_78.capacity = iVar27;
      }
      memset(local_78.list,0,(long)local_78.capacity);
    }
    local_dc = length - uVar11;
    uVar7 = this->strings->count;
    lVar22 = 0;
    if (this->all != '\0') {
      lVar22 = (long)(int)uVar7;
    }
    local_48 = this->spanLengths + lVar22;
    local_50 = (long)length;
    local_40 = s;
LAB_002e0b2f:
    do {
      if (spanCondition == USET_SPAN_CONTAINED) {
        pUVar31 = s;
        uVar12 = uVar11;
        if (0 < (int)uVar7) {
          local_38 = (long)(int)local_dc;
          uVar21 = 0;
          do {
            bVar4 = local_48[uVar21];
            uVar29 = (uint)bVar4;
            if (bVar4 == 0xff) {
              iVar25 = 6;
            }
            else {
              pvVar15 = UVector::elementAt(this->strings,(int32_t)uVar21);
              uVar5 = *(ushort *)((long)pvVar15 + 8);
              if ((uVar5 & 0x11) == 0) {
                if ((uVar5 & 2) == 0) {
                  puVar16 = *(ushort **)((long)pvVar15 + 0x18);
                }
                else {
                  puVar16 = (ushort *)((long)pvVar15 + 10);
                }
              }
              else {
                puVar16 = (ushort *)0x0;
              }
              if ((short)uVar5 < 0) {
                iVar27 = *(int *)((long)pvVar15 + 0xc);
              }
              else {
                iVar27 = (int)(short)uVar5 >> 5;
              }
              if (bVar4 == 0xfe) {
                uVar29 = 0xffffffff;
                if ((iVar27 != 1) && ((*puVar16 & 0xfc00) == 0xd800)) {
                  uVar29 = ~(uint)((puVar16[1] & 0xfc00) == 0xdc00);
                }
                uVar29 = uVar29 + iVar27;
              }
              uVar20 = local_dc;
              if ((int)uVar29 < (int)local_dc) {
                uVar20 = uVar29;
              }
              iVar25 = 0;
              if ((int)(iVar27 - uVar20) <= (int)uVar11) {
                lVar22 = (long)iVar27;
                lVar24 = (long)(int)(iVar27 - uVar20);
                uVar8 = local_dc;
                if ((int)uVar29 < (int)local_dc) {
                  uVar8 = uVar29;
                }
                iVar25 = uVar11 + 1 + uVar20;
                lVar19 = (long)(int)uVar29;
                if (local_38 <= (int)uVar29) {
                  lVar19 = local_38;
                }
                pUVar28 = s + (long)(int)uVar11 + (lVar19 - lVar22);
                do {
                  iVar18 = local_78.start + (uint)lVar24;
                  iVar9 = local_78.capacity;
                  if (iVar18 < local_78.capacity) {
                    iVar9 = 0;
                  }
                  iVar18 = iVar18 - iVar9;
                  if (local_78.list[iVar18] == '\0') {
                    lVar19 = (int)uVar11 - lVar24;
                    pUVar1 = pUVar31 + lVar19;
                    lVar23 = 0;
                    iVar9 = iVar27;
                    do {
                      psVar2 = (short *)((long)pUVar28 + lVar23);
                      psVar3 = (short *)((long)puVar16 + lVar23);
                      if (*psVar2 != *psVar3) break;
                      lVar23 = lVar23 + 2;
                      bVar32 = 1 < iVar9;
                      iVar9 = iVar9 + -1;
                    } while (bVar32);
                    pUVar31 = local_40;
                    if (((*psVar2 == *psVar3) &&
                        (((lVar19 < 1 || ((pUVar1[-1] & 0xfc00U) != 0xd800)) ||
                         ((*pUVar1 & 0xfc00U) != 0xdc00)))) &&
                       (((local_50 - lVar22 <= lVar19 || ((pUVar1[lVar22 + -1] & 0xfc00U) != 0xd800)
                         ) || ((pUVar1[lVar22] & 0xfc00U) != 0xdc00)))) {
                      if (uVar11 == (uint)lVar24) {
                        local_d8 = 0;
                        iVar25 = 1;
                        goto LAB_002e0d93;
                      }
                      local_78.list[iVar18] = '\x01';
                      local_78.length = local_78.length + 1;
                    }
                  }
                  bVar32 = uVar20 == 0;
                  uVar20 = uVar20 - 1;
                  if (bVar32) break;
                  lVar24 = lVar24 + 1;
                  pUVar28 = pUVar28 + -1;
                } while (iVar25 - uVar8 != (int)lVar24);
                iVar25 = 0;
              }
            }
LAB_002e0d93:
            if ((iVar25 != 6) && (uVar29 = local_d8, iVar25 != 0)) goto LAB_002e1162;
            uVar21 = uVar21 + 1;
          } while (uVar21 != uVar7);
        }
      }
      else {
        if ((int)uVar7 < 1) {
          iVar25 = 0;
          bVar32 = false;
        }
        else {
          lVar22 = (long)(int)uVar11;
          uVar21 = 0;
          uVar29 = 0;
          iVar25 = 0;
          pUVar31 = s;
          do {
            bVar4 = local_48[uVar21];
            pvVar15 = UVector::elementAt(this->strings,(int32_t)uVar21);
            uVar5 = *(ushort *)((long)pvVar15 + 8);
            if ((uVar5 & 0x11) == 0) {
              if ((uVar5 & 2) == 0) {
                lVar24 = *(long *)((long)pvVar15 + 0x18);
              }
              else {
                lVar24 = (long)pvVar15 + 10;
              }
            }
            else {
              lVar24 = 0;
            }
            if ((short)uVar5 < 0) {
              uVar12 = *(uint *)((long)pvVar15 + 0xc);
            }
            else {
              uVar12 = (int)(short)uVar5 >> 5;
            }
            uVar20 = (uint)bVar4;
            if (0xfd < bVar4) {
              uVar20 = uVar12;
            }
            uVar8 = local_dc;
            if ((int)uVar20 < (int)local_dc) {
              uVar8 = uVar20;
            }
            if (((int)(uVar12 - uVar8) <= (int)uVar11) && ((int)uVar29 <= (int)uVar8)) {
              lVar26 = (long)(int)uVar12;
              lVar23 = (long)(int)(uVar12 - uVar8);
              lVar19 = (long)(int)uVar20;
              if ((long)(int)local_dc <= (long)(int)uVar20) {
                lVar19 = (long)(int)local_dc;
              }
              pUVar28 = s + lVar22 + (lVar19 - lVar26);
              do {
                if (((int)uVar29 < (int)uVar8) || (iVar25 < lVar23)) {
                  lVar30 = lVar22 - lVar23;
                  pUVar1 = pUVar31 + lVar30;
                  lVar19 = 0;
                  uVar20 = uVar12;
                  do {
                    psVar2 = (short *)((long)pUVar28 + lVar19);
                    psVar3 = (short *)(lVar24 + lVar19);
                    if (*psVar2 != *psVar3) break;
                    lVar19 = lVar19 + 2;
                    bVar32 = 1 < (int)uVar20;
                    uVar20 = uVar20 - 1;
                  } while (bVar32);
                  pUVar31 = local_40;
                  if (((*psVar2 == *psVar3) &&
                      (((lVar30 < 1 || ((pUVar1[-1] & 0xfc00U) != 0xd800)) ||
                       ((*pUVar1 & 0xfc00U) != 0xdc00)))) &&
                     (((local_50 - lVar26 <= lVar30 || ((pUVar1[lVar26 + -1] & 0xfc00U) != 0xd800))
                      || ((pUVar1[lVar26] & 0xfc00U) != 0xdc00)))) {
                    iVar25 = (int)lVar23;
                    uVar29 = uVar8;
                    break;
                  }
                }
                if (lVar22 <= lVar23) break;
                lVar23 = lVar23 + 1;
                pUVar28 = pUVar28 + -1;
                bVar32 = (int)uVar29 < (int)uVar8;
                uVar8 = uVar8 - 1;
              } while (bVar32);
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 != uVar7);
          bVar32 = uVar29 != 0;
          s = pUVar31;
        }
        cVar17 = '\0';
        if ((iVar25 != 0) || (bVar32)) {
          uVar11 = uVar11 - iVar25;
          bVar32 = uVar11 != 0;
          if (bVar32) {
            local_dc = 0;
          }
          cVar17 = bVar32 * '\x02' + '\x01';
          if (!bVar32) {
            local_d8 = 0;
          }
        }
        if (cVar17 == '\x03') goto LAB_002e0b2f;
        pUVar31 = s;
        uVar29 = local_d8;
        uVar12 = uVar11;
        if (cVar17 != '\0') break;
      }
      s = pUVar31;
      if ((local_dc != 0) || (uVar12 == length)) {
        uVar29 = uVar12;
        if (local_78.length == 0) break;
LAB_002e1076:
        iVar13 = OffsetList::popMinimum(&local_78);
        uVar11 = uVar12 - iVar13;
        local_dc = 0;
        goto LAB_002e0b2f;
      }
      if (local_78.length != 0) {
        UVar6 = pUVar31[(long)(int)uVar12 + -1];
        if ((((int)uVar12 < 2) || ((UVar6 & 0xfc00U) != 0xdc00)) ||
           ((pUVar31[(ulong)uVar12 - 2] & 0xfc00U) != 0xd800)) {
          UVar10 = UnicodeSet::contains(this_00,(uint)(ushort)UVar6);
          uVar29 = -(uint)(UVar10 == '\0') | 1;
        }
        else {
          UVar10 = UnicodeSet::contains
                             (this_00,(uint)(ushort)UVar6 +
                                      (uint)(ushort)pUVar31[(ulong)uVar12 - 2] * 0x400 + -0x35fdc00)
          ;
          uVar29 = (uint)(UVar10 != '\0') * 4 - 2;
        }
        if ((int)uVar29 < 1) goto LAB_002e1076;
        uVar11 = uVar12 - uVar29;
        if (uVar11 == 0) {
          local_d8 = 0;
          uVar29 = local_d8;
          break;
        }
        iVar13 = local_78.capacity;
        if ((int)(uVar29 + local_78.start) < local_78.capacity) {
          iVar13 = 0;
        }
        local_78.start = (uVar29 + local_78.start) - iVar13;
        if (local_78.list[local_78.start] != '\0') {
          local_78.list[local_78.start] = '\0';
          local_78.length = local_78.length + -1;
        }
        local_dc = 0;
        goto LAB_002e0b2f;
      }
      uVar11 = UnicodeSet::spanBack(this_00,pUVar31,uVar12,USET_SPAN_CONTAINED);
      local_dc = uVar12 - uVar11;
      uVar29 = uVar11;
    } while (uVar11 != 0 && local_dc != 0);
LAB_002e1162:
    local_d8 = uVar29;
    OffsetList::~OffsetList(&local_78);
  }
  return local_d8;
}

Assistant:

int32_t UnicodeSetStringSpan::spanBack(const UChar *s, int32_t length, USetSpanCondition spanCondition) const {
    if(spanCondition==USET_SPAN_NOT_CONTAINED) {
        return spanNotBack(s, length);
    }
    int32_t pos=spanSet.spanBack(s, length, USET_SPAN_CONTAINED);
    if(pos==0) {
        return 0;
    }
    int32_t spanLength=length-pos;

    // Consider strings; they may overlap with the span.
    OffsetList offsets;
    if(spanCondition==USET_SPAN_CONTAINED) {
        // Use offset list to try all possibilities.
        offsets.setMaxLength(maxLength16);
    }
    int32_t i, stringsLength=strings.size();
    uint8_t *spanBackLengths=spanLengths;
    if(all) {
        spanBackLengths+=stringsLength;
    }
    for(;;) {
        if(spanCondition==USET_SPAN_CONTAINED) {
            for(i=0; i<stringsLength; ++i) {
                int32_t overlap=spanBackLengths[i];
                if(overlap==ALL_CP_CONTAINED) {
                    continue;  // Irrelevant string.
                }
                const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
                const UChar *s16=string.getBuffer();
                int32_t length16=string.length();

                // Try to match this string at pos-(length16-overlap)..pos-length16.
                if(overlap>=LONG_SPAN) {
                    overlap=length16;
                    // While contained: No point matching fully inside the code point span.
                    int32_t len1=0;
                    U16_FWD_1(s16, len1, overlap);
                    overlap-=len1;  // Length of the string minus the first code point.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t dec=length16-overlap;  // Keep dec+overlap==length16.
                for(;;) {
                    if(dec>pos) {
                        break;
                    }
                    // Try to match if the decrement is not listed already.
                    if(!offsets.containsOffset(dec) && matches16CPB(s, pos-dec, length, s16, length16)) {
                        if(dec==pos) {
                            return 0;  // Reached the start of the string.
                        }
                        offsets.addOffset(dec);
                    }
                    if(overlap==0) {
                        break;
                    }
                    --overlap;
                    ++dec;
                }
            }
        } else /* USET_SPAN_SIMPLE */ {
            int32_t maxDec=0, maxOverlap=0;
            for(i=0; i<stringsLength; ++i) {
                int32_t overlap=spanBackLengths[i];
                // For longest match, we do need to try to match even an all-contained string
                // to find the match from the latest end.

                const UnicodeString &string=*(const UnicodeString *)strings.elementAt(i);
                const UChar *s16=string.getBuffer();
                int32_t length16=string.length();

                // Try to match this string at pos-(length16-overlap)..pos-length16.
                if(overlap>=LONG_SPAN) {
                    overlap=length16;
                    // Longest match: Need to match fully inside the code point span
                    // to find the match from the latest end.
                }
                if(overlap>spanLength) {
                    overlap=spanLength;
                }
                int32_t dec=length16-overlap;  // Keep dec+overlap==length16.
                for(;;) {
                    if(dec>pos || overlap<maxOverlap) {
                        break;
                    }
                    // Try to match if the string is longer or ends later.
                    if( (overlap>maxOverlap || /* redundant overlap==maxOverlap && */ dec>maxDec) &&
                        matches16CPB(s, pos-dec, length, s16, length16)
                    ) {
                        maxDec=dec;  // Longest match from latest end.
                        maxOverlap=overlap;
                        break;
                    }
                    --overlap;
                    ++dec;
                }
            }

            if(maxDec!=0 || maxOverlap!=0) {
                // Longest-match algorithm, and there was a string match.
                // Simply continue before it.
                pos-=maxDec;
                if(pos==0) {
                    return 0;  // Reached the start of the string.
                }
                spanLength=0;  // Match strings from before a string match.
                continue;
            }
        }
        // Finished trying to match all strings at pos.

        if(spanLength!=0 || pos==length) {
            // The position is before an unlimited code point span (spanLength!=0),
            // not before a string match.
            // The only position where spanLength==0 before a span is pos==length.
            // Otherwise, an unlimited code point span is only tried again when no
            // strings match, and if such a non-initial span fails we stop.
            if(offsets.isEmpty()) {
                return pos;  // No strings matched before a span.
            }
            // Match strings from before the next string match.
        } else {
            // The position is before a string match (or a single code point).
            if(offsets.isEmpty()) {
                // No more strings matched before a previous string match.
                // Try another code point span from before the last string match.
                int32_t oldPos=pos;
                pos=spanSet.spanBack(s, oldPos, USET_SPAN_CONTAINED);
                spanLength=oldPos-pos;
                if( pos==0 ||           // Reached the start of the string, or
                    spanLength==0       // neither strings nor span progressed.
                ) {
                    return pos;
                }
                continue;  // spanLength>0: Match strings from before a span.
            } else {
                // Try to match only one code point from before a string match if some
                // string matched beyond it, so that we try all possible positions
                // and don't overshoot.
                spanLength=spanOneBack(spanSet, s, pos);
                if(spanLength>0) {
                    if(spanLength==pos) {
                        return 0;  // Reached the start of the string.
                    }
                    // Match strings before this code point.
                    // There cannot be any decrements below it because UnicodeSet strings
                    // contain multiple code points.
                    pos-=spanLength;
                    offsets.shift(spanLength);
                    spanLength=0;
                    continue;  // Match strings from before a single code point.
                }
                // Match strings from before the next string match.
            }
        }
        pos-=offsets.popMinimum();
        spanLength=0;  // Match strings from before a string match.
    }
}